

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathNodeCollectAndTest
              (xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first,xmlNodePtr *last
              ,int toBool)

{
  xmlXPathContextPtr ctxt_00;
  xmlNodePtr pxVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  xmlNodePtr pxVar9;
  xmlXPathStepOpPtr pxVar10;
  int iVar11;
  undefined4 extraout_var;
  xmlXPathObjectPtr value;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  xmlNsPtr ns;
  xmlAttrPtr attr;
  xmlXPathContextPtr xpctxt;
  xmlNodePtr oldContextNode;
  xmlXPathNodeSetMergeFunction mergeAndClear;
  _func_int_xmlNodeSetPtr_xmlNodePtr *addNode;
  xmlXPathTraversalFunction next;
  int local_b0;
  int breakOnFirstHit;
  int pos;
  int hasAxisRange;
  int hasPredicateRange;
  int maxPos;
  xmlXPathStepOpPtr predOp;
  xmlNodePtr cur;
  xmlNodeSetPtr seq;
  xmlNodeSetPtr outSeq;
  xmlNodePtr contextNode;
  xmlNodePtr *ppxStack_70;
  int contextIdx;
  xmlNodeSetPtr contextSeq;
  xmlXPathObjectPtr obj;
  int hasNsNodes;
  int total;
  xmlChar *URI;
  xmlChar *name;
  xmlChar *prefix;
  xmlXPathTypeVal type;
  xmlXPathTestVal test;
  xmlXPathAxisVal axis;
  int toBool_local;
  xmlNodePtr *last_local;
  xmlNodePtr *first_local;
  xmlXPathStepOpPtr op_local;
  xmlXPathParserContextPtr ctxt_local;
  
  type = op->value;
  prefix._4_4_ = op->value2;
  prefix._0_4_ = op->value3;
  name = (xmlChar *)op->value4;
  URI = (xmlChar *)op->value5;
  _hasNsNodes = (xmlChar *)0x0;
  obj._4_4_ = 0;
  obj._0_4_ = 0;
  addNode = (_func_int_xmlNodeSetPtr_xmlNodePtr *)0x0;
  ctxt_00 = ctxt->context;
  test = toBool;
  _axis = last;
  last_local = first;
  first_local = (xmlNodePtr *)op;
  op_local = (xmlXPathStepOpPtr)ctxt;
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NODESET)) {
    xmlXPathErr(ctxt,0xb);
    ctxt_local._4_4_ = 0;
  }
  else {
    contextSeq = (xmlNodeSetPtr)xmlXPathValuePop(ctxt);
    if ((name == (xmlChar *)0x0) ||
       (_hasNsNodes = xmlXPathNsLookup(ctxt_00,name), _hasNsNodes != (xmlChar *)0x0)) {
      oldContextNode = (xmlNodePtr)xmlXPathNodeSetMergeAndClear;
      switch(type) {
      case 1:
        last_local = (xmlNodePtr *)0x0;
        addNode = xmlXPathNextAncestor;
        break;
      case 2:
        last_local = (xmlNodePtr *)0x0;
        addNode = xmlXPathNextAncestorOrSelf;
        break;
      case NODE_TYPE_TEXT:
        last_local = (xmlNodePtr *)0x0;
        _axis = (xmlNodePtr *)0x0;
        addNode = xmlXPathNextAttribute;
        oldContextNode = (xmlNodePtr)xmlXPathNodeSetMergeAndClearNoDupls;
        break;
      case 4:
        _axis = (xmlNodePtr *)0x0;
        if (((prefix._4_4_ == 5) || (prefix._4_4_ == 3)) && ((int)prefix == 0)) {
          addNode = xmlXPathNextChildElement;
        }
        else {
          addNode = xmlXPathNextChild;
        }
        oldContextNode = (xmlNodePtr)xmlXPathNodeSetMergeAndClearNoDupls;
        break;
      case 5:
        _axis = (xmlNodePtr *)0x0;
        addNode = xmlXPathNextDescendant;
        break;
      case 6:
        _axis = (xmlNodePtr *)0x0;
        addNode = xmlXPathNextDescendantOrSelf;
        break;
      case NODE_TYPE_PI:
        _axis = (xmlNodePtr *)0x0;
        addNode = xmlXPathNextFollowing;
        break;
      case NODE_TYPE_COMMENT:
        _axis = (xmlNodePtr *)0x0;
        addNode = xmlXPathNextFollowingSibling;
        break;
      case 9:
        last_local = (xmlNodePtr *)0x0;
        _axis = (xmlNodePtr *)0x0;
        addNode = xmlXPathNextNamespace;
        oldContextNode = (xmlNodePtr)xmlXPathNodeSetMergeAndClearNoDupls;
        break;
      case 10:
        last_local = (xmlNodePtr *)0x0;
        addNode = xmlXPathNextParent;
        break;
      case NODE_TYPE_COMMENT|NODE_TYPE_TEXT:
        last_local = (xmlNodePtr *)0x0;
        addNode = xmlXPathNextPrecedingInternal;
        break;
      case 0xc:
        last_local = (xmlNodePtr *)0x0;
        addNode = xmlXPathNextPrecedingSibling;
        break;
      case 0xd:
        last_local = (xmlNodePtr *)0x0;
        _axis = (xmlNodePtr *)0x0;
        addNode = xmlXPathNextSelf;
        oldContextNode = (xmlNodePtr)xmlXPathNodeSetMergeAndClearNoDupls;
      }
      if (addNode == (_func_int_xmlNodeSetPtr_xmlNodePtr *)0x0) {
        xmlXPathReleaseObject(ctxt_00,(xmlXPathObjectPtr)contextSeq);
        ctxt_local._4_4_ = 0;
      }
      else {
        ppxStack_70 = contextSeq->nodeTab;
        if ((ppxStack_70 == (xmlNodePtr *)0x0) || (*(int *)ppxStack_70 < 1)) {
          xmlXPathValuePush((xmlXPathParserContextPtr)op_local,(xmlXPathObjectPtr)contextSeq);
          ctxt_local._4_4_ = 0;
        }
        else {
          hasAxisRange = 0;
          _hasPredicateRange = (xmlXPathStepOpPtr)0x0;
          bVar8 = false;
          bVar12 = false;
          if (*(int *)(first_local + 1) != -1) {
            _hasPredicateRange =
                 (xmlXPathStepOpPtr)
                 (*(long *)(*(long *)(op_local + 1) + 8) + (long)*(int *)(first_local + 1) * 0x38);
            iVar11 = xmlXPathIsPositionalPredicate
                               ((xmlXPathParserContextPtr)op_local,_hasPredicateRange,&hasAxisRange)
            ;
            if (iVar11 != 0) {
              bVar12 = _hasPredicateRange->ch1 == -1;
              if (bVar12) {
                _hasPredicateRange = (xmlXPathStepOpPtr)0x0;
              }
              else {
                _hasPredicateRange =
                     (xmlXPathStepOpPtr)
                     (*(long *)(*(long *)(op_local + 1) + 8) + (long)_hasPredicateRange->ch1 * 0x38)
                ;
              }
              bVar8 = !bVar12;
            }
          }
          bVar13 = test != NODE_TEST_NONE;
          bVar14 = _hasPredicateRange == (xmlXPathStepOpPtr)0x0;
          pxVar1 = ctxt_00->node;
          seq = (xmlNodeSetPtr)0x0;
          cur = (xmlNodePtr)0x0;
          outSeq = (xmlNodeSetPtr)0x0;
          contextNode._4_4_ = 0;
          do {
            do {
              if ((contextNode._4_4_ < *(int *)ppxStack_70) ||
                 (bVar15 = false, outSeq != (xmlNodeSetPtr)0x0)) {
                bVar15 = op_local->value2 == 0;
              }
              if (!bVar15) goto LAB_00234465;
              iVar11 = contextNode._4_4_ + 1;
              ctxt_00->node = (xmlNodePtr)(&ppxStack_70[1]->_private)[contextNode._4_4_];
              contextNode._4_4_ = iVar11;
              if ((cur == (xmlNodePtr)0x0) &&
                 (cur = (xmlNodePtr)xmlXPathNodeSetCreate((xmlNodePtr)0x0), cur == (xmlNodePtr)0x0))
              {
                xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                obj._4_4_ = 0;
                goto LAB_00234465;
              }
              local_b0 = 0;
              predOp = (xmlXPathStepOpPtr)0x0;
              obj._0_4_ = 0;
              do {
                if ((*(long *)((long)op_local->value4 + 0x160) != 0) &&
                   (iVar11 = xmlXPathCheckOpLimit((xmlXPathParserContextPtr)op_local,1), iVar11 < 0)
                   ) goto LAB_00234465;
                iVar11 = (*addNode)((xmlNodeSetPtr)op_local,(xmlNodePtr)predOp);
                predOp = (xmlXPathStepOpPtr)CONCAT44(extraout_var,iVar11);
                if ((((xmlNodePtr)predOp == (xmlNodePtr)0x0) ||
                    (((last_local != (xmlNodePtr *)0x0 && (*last_local != (xmlNodePtr)0x0)) &&
                     ((*last_local == (xmlNodePtr)predOp ||
                      ((obj._4_4_ % 0x100 == 0 &&
                       (iVar11 = xmlXPathCmpNodesExt(*last_local,(xmlNodePtr)predOp), -1 < iVar11)))
                      ))))) ||
                   ((_axis != (xmlNodePtr *)0x0 &&
                    ((*_axis != (xmlNodePtr)0x0 &&
                     ((*_axis == (xmlNodePtr)predOp ||
                      ((obj._4_4_ % 0x100 == 0 &&
                       (iVar11 = xmlXPathCmpNodesExt((xmlNodePtr)predOp,*_axis), -1 < iVar11))))))))
                   )) break;
                pxVar10 = predOp;
                obj._4_4_ = obj._4_4_ + 1;
                switch(prefix._4_4_) {
                case 0:
                  obj._4_4_ = 0;
                  goto LAB_00234465;
                case 1:
                  if ((int)prefix == 0) {
                    iVar11 = predOp->ch2;
                    if (((iVar11 - 1U < 4) || (iVar11 - 7U < 3)) || (iVar11 == 0xd)) {
                      if (!bVar12) {
                        iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                        pxVar9 = cur;
                        if (iVar11 < 0) {
                          xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                          pxVar9 = cur;
                        }
                        goto joined_r0x002338d9;
                      }
                      local_b0 = local_b0 + 1;
                      if (local_b0 == hasAxisRange) {
                        iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                        if (iVar11 < 0) {
                          xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                        }
                        goto LAB_002342c1;
                      }
                    }
                    else if (iVar11 == 0x12) {
                      if (type == 9) {
                        if (!bVar12) {
                          obj._0_4_ = 1;
                          iVar11 = xmlXPathNodeSetAddNs
                                             ((xmlNodeSetPtr)cur,ctxt_00->node,(xmlNsPtr)predOp);
                          pxVar9 = cur;
                          if (iVar11 < 0) {
                            xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                            pxVar9 = cur;
                          }
                          goto joined_r0x002338d9;
                        }
                        local_b0 = local_b0 + 1;
                        if (local_b0 == hasAxisRange) {
                          obj._0_4_ = 1;
                          iVar11 = xmlXPathNodeSetAddNs
                                             ((xmlNodeSetPtr)cur,ctxt_00->node,(xmlNsPtr)predOp);
                          if (iVar11 < 0) {
                            xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                          }
                          goto LAB_002342c1;
                        }
                      }
                      else {
                        obj._0_4_ = 1;
                        if (!bVar12) {
                          iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                          pxVar9 = cur;
                          if (iVar11 < 0) {
                            xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                            pxVar9 = cur;
                          }
                          goto joined_r0x002338d9;
                        }
                        local_b0 = local_b0 + 1;
                        if (local_b0 == hasAxisRange) {
                          iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                          if (iVar11 < 0) {
                            xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                          }
                          goto LAB_002342c1;
                        }
                      }
                    }
                  }
                  else if (predOp->ch2 == (int)prefix) {
                    if (predOp->ch2 != 0x12) {
                      if (bVar12) {
                        local_b0 = local_b0 + 1;
                        if (local_b0 != hasAxisRange) break;
                        iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                        if (iVar11 < 0) {
                          xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                        }
                        goto LAB_002342c1;
                      }
                      iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                      pxVar9 = cur;
                      if (iVar11 < 0) {
                        xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                        pxVar9 = cur;
                      }
                      goto joined_r0x002338d9;
                    }
                    if (!bVar12) {
                      obj._0_4_ = 1;
                      iVar11 = xmlXPathNodeSetAddNs
                                         ((xmlNodeSetPtr)cur,ctxt_00->node,(xmlNsPtr)predOp);
                      pxVar9 = cur;
                      if (iVar11 < 0) {
                        xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                        pxVar9 = cur;
                      }
                      goto joined_r0x002338d9;
                    }
                    local_b0 = local_b0 + 1;
                    if (local_b0 == hasAxisRange) {
                      obj._0_4_ = 1;
                      iVar11 = xmlXPathNodeSetAddNs
                                         ((xmlNodeSetPtr)cur,ctxt_00->node,(xmlNsPtr)predOp);
                      if (iVar11 < 0) {
                        xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                      }
                      goto LAB_002342c1;
                    }
                  }
                  else if (((int)prefix == 3) && (predOp->ch2 == 4)) {
                    if (!bVar12) {
                      iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                      pxVar9 = cur;
                      if (iVar11 < 0) {
                        xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                        pxVar9 = cur;
                      }
                      goto joined_r0x002338d9;
                    }
                    local_b0 = local_b0 + 1;
                    if (local_b0 == hasAxisRange) {
                      iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                      if (iVar11 < 0) {
                        xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                      }
                      goto LAB_002342c1;
                    }
                  }
                  break;
                case 2:
                  if ((predOp->ch2 == 7) &&
                     ((URI == (xmlChar *)0x0 ||
                      (iVar11 = xmlStrEqual(URI,*(xmlChar **)&predOp->value2), iVar11 != 0)))) {
                    if (!bVar12) {
                      iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                      pxVar9 = cur;
                      if (iVar11 < 0) {
                        xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                        pxVar9 = cur;
                      }
                      goto joined_r0x002338d9;
                    }
                    local_b0 = local_b0 + 1;
                    if (local_b0 == hasAxisRange) {
                      iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                      if (iVar11 < 0) {
                        xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                      }
                      goto LAB_002342c1;
                    }
                  }
                  break;
                case 3:
                  if (type == NODE_TYPE_TEXT) {
                    if (predOp->ch2 == 2) {
                      if (name == (xmlChar *)0x0) {
                        if (!bVar12) {
                          iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                          pxVar9 = cur;
                          if (iVar11 < 0) {
                            xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                            pxVar9 = cur;
                          }
                          goto joined_r0x002338d9;
                        }
                        local_b0 = local_b0 + 1;
                        if (local_b0 == hasAxisRange) {
                          iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                          if (iVar11 < 0) {
                            xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                          }
                          goto LAB_002342c1;
                        }
                      }
                      else {
                        lVar2._0_4_ = predOp[1].value2;
                        lVar2._4_4_ = predOp[1].value3;
                        if ((lVar2 != 0) &&
                           (iVar11 = xmlStrEqual(_hasNsNodes,
                                                 *(xmlChar **)(*(long *)&predOp[1].value2 + 0x10)),
                           iVar11 != 0)) {
                          if (!bVar12) {
                            iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp)
                            ;
                            pxVar9 = cur;
                            if (iVar11 < 0) {
                              xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                              pxVar9 = cur;
                            }
                            goto joined_r0x002338d9;
                          }
                          local_b0 = local_b0 + 1;
                          if (local_b0 == hasAxisRange) {
                            iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp)
                            ;
                            if (iVar11 < 0) {
                              xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                            }
                            goto LAB_002342c1;
                          }
                        }
                      }
                    }
                  }
                  else if (type == 9) {
                    if (predOp->ch2 == 0x12) {
                      if (!bVar12) {
                        obj._0_4_ = 1;
                        iVar11 = xmlXPathNodeSetAddNs
                                           ((xmlNodeSetPtr)cur,ctxt_00->node,(xmlNsPtr)predOp);
                        pxVar9 = cur;
                        if (iVar11 < 0) {
                          xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                          pxVar9 = cur;
                        }
                        goto joined_r0x002338d9;
                      }
                      local_b0 = local_b0 + 1;
                      if (local_b0 == hasAxisRange) {
                        obj._0_4_ = 1;
                        iVar11 = xmlXPathNodeSetAddNs
                                           ((xmlNodeSetPtr)cur,ctxt_00->node,(xmlNsPtr)predOp);
                        if (iVar11 < 0) {
                          xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                        }
                        goto LAB_002342c1;
                      }
                    }
                  }
                  else if (predOp->ch2 == 1) {
                    if (name == (xmlChar *)0x0) {
                      if (!bVar12) {
                        iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                        pxVar9 = cur;
                        if (iVar11 < 0) {
                          xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                          pxVar9 = cur;
                        }
                        goto joined_r0x002338d9;
                      }
                      local_b0 = local_b0 + 1;
                      if (local_b0 == hasAxisRange) {
                        iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                        if (iVar11 < 0) {
                          xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                        }
                        goto LAB_002342c1;
                      }
                    }
                    else {
                      lVar3._0_4_ = predOp[1].value2;
                      lVar3._4_4_ = predOp[1].value3;
                      if ((lVar3 != 0) &&
                         (iVar11 = xmlStrEqual(_hasNsNodes,
                                               *(xmlChar **)(*(long *)&predOp[1].value2 + 0x10)),
                         iVar11 != 0)) {
                        if (!bVar12) {
                          iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                          pxVar9 = cur;
                          if (iVar11 < 0) {
                            xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                            pxVar9 = cur;
                          }
                          goto joined_r0x002338d9;
                        }
                        local_b0 = local_b0 + 1;
                        if (local_b0 == hasAxisRange) {
                          iVar11 = xmlXPathNodeSetAddUnique((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                          if (iVar11 < 0) {
                            xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                          }
                          goto LAB_002342c1;
                        }
                      }
                    }
                  }
                  break;
                case 4:
                  break;
                case 5:
                  if (type == NODE_TYPE_TEXT) {
                    if (predOp->ch2 == 2) goto LAB_00233e2b;
                  }
                  else if (type == 9) {
                    if (predOp->ch2 == 0x12) {
LAB_00233e2b:
                      iVar11 = predOp->ch2;
                      if (iVar11 == 1) {
                        iVar11 = xmlStrEqual(URI,*(xmlChar **)&predOp->value2);
                        if (iVar11 != 0) {
                          if (name == (xmlChar *)0x0) {
                            lVar4._0_4_ = predOp[1].value2;
                            lVar4._4_4_ = predOp[1].value3;
                            if (lVar4 == 0) {
                              if (bVar12) {
                                local_b0 = local_b0 + 1;
                                if (local_b0 == hasAxisRange) {
                                  iVar11 = xmlXPathNodeSetAddUnique
                                                     ((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                                  if (iVar11 < 0) {
                                    xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                                  }
LAB_002342c1:
                                  pxVar9 = cur;
                                  if (seq == (xmlNodeSetPtr)0x0) {
                                    cur = (xmlNodePtr)0x0;
                                    seq = (xmlNodeSetPtr)pxVar9;
                                  }
                                  else {
                                    seq = (xmlNodeSetPtr)(*(code *)oldContextNode)(seq,cur);
                                    if ((xmlNodePtr)seq == (xmlNodePtr)0x0) {
                                      xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                                    }
                                  }
                                  goto joined_r0x0023430e;
                                }
                              }
                              else {
                                iVar11 = xmlXPathNodeSetAddUnique
                                                   ((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                                pxVar9 = cur;
                                if (iVar11 < 0) {
                                  xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                                  pxVar9 = cur;
                                }
joined_r0x002338d9:
                                cur = pxVar9;
                                if (bVar13 && bVar14) {
                                  if (seq == (xmlNodeSetPtr)0x0) {
                                    cur = (xmlNodePtr)0x0;
                                    seq = (xmlNodeSetPtr)pxVar9;
                                  }
                                  else {
                                    seq = (xmlNodeSetPtr)(*(code *)oldContextNode)(seq,pxVar9);
                                    if (seq == (xmlNodeSetPtr)0x0) {
                                      xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                                    }
                                  }
                                  goto LAB_00234465;
                                }
                              }
                            }
                          }
                          else {
                            lVar5._0_4_ = predOp[1].value2;
                            lVar5._4_4_ = predOp[1].value3;
                            if ((lVar5 != 0) &&
                               (iVar11 = xmlStrEqual(_hasNsNodes,
                                                     *(xmlChar **)
                                                      (*(long *)&predOp[1].value2 + 0x10)),
                               iVar11 != 0)) {
                              if (!bVar12) {
                                iVar11 = xmlXPathNodeSetAddUnique
                                                   ((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                                pxVar9 = cur;
                                if (iVar11 < 0) {
                                  xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                                  pxVar9 = cur;
                                }
                                goto joined_r0x002338d9;
                              }
                              local_b0 = local_b0 + 1;
                              if (local_b0 == hasAxisRange) {
                                iVar11 = xmlXPathNodeSetAddUnique
                                                   ((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                                if (iVar11 < 0) {
                                  xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                                }
                                goto LAB_002342c1;
                              }
                            }
                          }
                        }
                      }
                      else if (iVar11 == 2) {
                        iVar11 = xmlStrEqual(URI,*(xmlChar **)&predOp->value2);
                        if (iVar11 != 0) {
                          if (name == (xmlChar *)0x0) {
                            lVar6._0_4_ = pxVar10[1].value2;
                            lVar6._4_4_ = pxVar10[1].value3;
                            if ((lVar6 == 0) || (*(long *)(*(long *)&pxVar10[1].value2 + 0x18) == 0)
                               ) {
                              if (!bVar12) {
                                iVar11 = xmlXPathNodeSetAddUnique
                                                   ((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                                pxVar9 = cur;
                                if (iVar11 < 0) {
                                  xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                                  pxVar9 = cur;
                                }
                                goto joined_r0x002338d9;
                              }
                              local_b0 = local_b0 + 1;
                              if (local_b0 == hasAxisRange) {
                                iVar11 = xmlXPathNodeSetAddUnique
                                                   ((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                                if (iVar11 < 0) {
                                  xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                                }
                                goto LAB_002342c1;
                              }
                            }
                          }
                          else {
                            lVar7._0_4_ = pxVar10[1].value2;
                            lVar7._4_4_ = pxVar10[1].value3;
                            if ((lVar7 != 0) &&
                               (iVar11 = xmlStrEqual(_hasNsNodes,
                                                     *(xmlChar **)
                                                      (*(long *)&pxVar10[1].value2 + 0x10)),
                               iVar11 != 0)) {
                              if (!bVar12) {
                                iVar11 = xmlXPathNodeSetAddUnique
                                                   ((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                                pxVar9 = cur;
                                if (iVar11 < 0) {
                                  xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                                  pxVar9 = cur;
                                }
                                goto joined_r0x002338d9;
                              }
                              local_b0 = local_b0 + 1;
                              if (local_b0 == hasAxisRange) {
                                iVar11 = xmlXPathNodeSetAddUnique
                                                   ((xmlNodeSetPtr)cur,(xmlNodePtr)predOp);
                                if (iVar11 < 0) {
                                  xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                                }
                                goto LAB_002342c1;
                              }
                            }
                          }
                        }
                      }
                      else if ((((iVar11 == 0x12) && (predOp->ch2 == 0x12)) &&
                               (predOp->value4 != (void *)0x0)) &&
                              ((URI != (xmlChar *)0x0 &&
                               (iVar11 = xmlStrEqual((xmlChar *)predOp->value4,URI), iVar11 != 0))))
                      {
                        if (!bVar12) {
                          obj._0_4_ = 1;
                          iVar11 = xmlXPathNodeSetAddNs
                                             ((xmlNodeSetPtr)cur,ctxt_00->node,(xmlNsPtr)predOp);
                          pxVar9 = cur;
                          if (iVar11 < 0) {
                            xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                            pxVar9 = cur;
                          }
                          goto joined_r0x002338d9;
                        }
                        local_b0 = local_b0 + 1;
                        if (local_b0 == hasAxisRange) {
                          obj._0_4_ = 1;
                          iVar11 = xmlXPathNodeSetAddNs
                                             ((xmlNodeSetPtr)cur,ctxt_00->node,(xmlNsPtr)predOp);
                          if (iVar11 < 0) {
                            xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
                          }
                          goto LAB_002342c1;
                        }
                      }
                    }
                  }
                  else if (predOp->ch2 == 1) goto LAB_00233e2b;
                }
                bVar15 = false;
                if (predOp != (xmlXPathStepOpPtr)0x0) {
                  bVar15 = op_local->value2 == 0;
                }
              } while (bVar15);
              if (op_local->value2 != 0) goto LAB_00234465;
              if ((_hasPredicateRange != (xmlXPathStepOpPtr)0x0) && (0 < *(int *)&cur->_private)) {
                if (bVar8) {
                  xmlXPathCompOpEvalPredicate
                            ((xmlXPathParserContextPtr)op_local,_hasPredicateRange,
                             (xmlNodeSetPtr)cur,hasAxisRange,hasAxisRange,(int)obj);
                }
                else {
                  xmlXPathCompOpEvalPredicate
                            ((xmlXPathParserContextPtr)op_local,_hasPredicateRange,
                             (xmlNodeSetPtr)cur,1,*(int *)&cur->_private,(int)obj);
                }
                if (op_local->value2 != 0) {
                  obj._4_4_ = 0;
                  goto LAB_00234465;
                }
              }
              pxVar9 = cur;
            } while (*(int *)&cur->_private < 1);
            if (seq == (xmlNodeSetPtr)0x0) {
              cur = (xmlNodePtr)0x0;
              seq = (xmlNodeSetPtr)pxVar9;
            }
            else {
              seq = (xmlNodeSetPtr)(*(code *)oldContextNode)(seq,cur);
              if ((xmlNodePtr)seq == (xmlNodePtr)0x0) {
                xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
              }
            }
joined_r0x0023430e:
          } while (test == NODE_TEST_NONE);
LAB_00234465:
          if ((contextSeq[1].nodeNr != 0) && (contextSeq[2].nodeTab != (xmlNodePtr *)0x0)) {
            *(undefined4 *)((long)op_local->value5 + 0x10) = 1;
            *(xmlNodePtr **)((long)op_local->value5 + 0x28) = contextSeq[2].nodeTab;
            contextSeq[2].nodeTab = (xmlNodePtr *)0x0;
            contextSeq[1].nodeNr = 0;
          }
          xmlXPathReleaseObject(ctxt_00,(xmlXPathObjectPtr)contextSeq);
          if (seq == (xmlNodeSetPtr)0x0) {
            if ((cur == (xmlNodePtr)0x0) || (*(int *)&cur->_private != 0)) {
              seq = xmlXPathNodeSetCreate((xmlNodePtr)0x0);
              if (seq == (xmlNodeSetPtr)0x0) {
                xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
              }
            }
            else {
              seq = (xmlNodeSetPtr)cur;
            }
          }
          if ((cur != (xmlNodePtr)0x0) && (cur != (xmlNodePtr)seq)) {
            xmlXPathFreeNodeSet((xmlNodeSetPtr)cur);
          }
          pxVar10 = op_local;
          value = xmlXPathCacheWrapNodeSet((xmlXPathParserContextPtr)op_local,seq);
          xmlXPathValuePush((xmlXPathParserContextPtr)pxVar10,value);
          ctxt_00->node = pxVar1;
          if (ctxt_00->tmpNsList != (xmlNsPtr *)0x0) {
            (*xmlFree)(ctxt_00->tmpNsList);
            ctxt_00->tmpNsList = (xmlNsPtr *)0x0;
          }
          ctxt_local._4_4_ = obj._4_4_;
        }
      }
    }
    else {
      xmlXPathReleaseObject(ctxt_00,(xmlXPathObjectPtr)contextSeq);
      xmlXPathErr((xmlXPathParserContextPtr)op_local,0x13);
      ctxt_local._4_4_ = 0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXPathNodeCollectAndTest(xmlXPathParserContextPtr ctxt,
                           xmlXPathStepOpPtr op,
			   xmlNodePtr * first, xmlNodePtr * last,
			   int toBool)
{

#define XP_TEST_HIT \
    if (hasAxisRange != 0) { \
	if (++pos == maxPos) { \
	    if (addNode(seq, cur) < 0) \
	        xmlXPathPErrMemory(ctxt); \
	    goto axis_range_end; } \
    } else { \
	if (addNode(seq, cur) < 0) \
	    xmlXPathPErrMemory(ctxt); \
	if (breakOnFirstHit) goto first_hit; }

#define XP_TEST_HIT_NS \
    if (hasAxisRange != 0) { \
	if (++pos == maxPos) { \
	    hasNsNodes = 1; \
	    if (xmlXPathNodeSetAddNs(seq, xpctxt->node, (xmlNsPtr) cur) < 0) \
	        xmlXPathPErrMemory(ctxt); \
	goto axis_range_end; } \
    } else { \
	hasNsNodes = 1; \
	if (xmlXPathNodeSetAddNs(seq, xpctxt->node, (xmlNsPtr) cur) < 0) \
	    xmlXPathPErrMemory(ctxt); \
	if (breakOnFirstHit) goto first_hit; }

    xmlXPathAxisVal axis = (xmlXPathAxisVal) op->value;
    xmlXPathTestVal test = (xmlXPathTestVal) op->value2;
    xmlXPathTypeVal type = (xmlXPathTypeVal) op->value3;
    const xmlChar *prefix = op->value4;
    const xmlChar *name = op->value5;
    const xmlChar *URI = NULL;

    int total = 0, hasNsNodes = 0;
    /* The popped object holding the context nodes */
    xmlXPathObjectPtr obj;
    /* The set of context nodes for the node tests */
    xmlNodeSetPtr contextSeq;
    int contextIdx;
    xmlNodePtr contextNode;
    /* The final resulting node set wrt to all context nodes */
    xmlNodeSetPtr outSeq;
    /*
    * The temporary resulting node set wrt 1 context node.
    * Used to feed predicate evaluation.
    */
    xmlNodeSetPtr seq;
    xmlNodePtr cur;
    /* First predicate operator */
    xmlXPathStepOpPtr predOp;
    int maxPos; /* The requested position() (when a "[n]" predicate) */
    int hasPredicateRange, hasAxisRange, pos;
    int breakOnFirstHit;

    xmlXPathTraversalFunction next = NULL;
    int (*addNode) (xmlNodeSetPtr, xmlNodePtr);
    xmlXPathNodeSetMergeFunction mergeAndClear;
    xmlNodePtr oldContextNode;
    xmlXPathContextPtr xpctxt = ctxt->context;


    CHECK_TYPE0(XPATH_NODESET);
    obj = xmlXPathValuePop(ctxt);
    /*
    * Setup namespaces.
    */
    if (prefix != NULL) {
        URI = xmlXPathNsLookup(xpctxt, prefix);
        if (URI == NULL) {
	    xmlXPathReleaseObject(xpctxt, obj);
            XP_ERROR0(XPATH_UNDEF_PREFIX_ERROR);
	}
    }
    /*
    * Setup axis.
    *
    * MAYBE FUTURE TODO: merging optimizations:
    * - If the nodes to be traversed wrt to the initial nodes and
    *   the current axis cannot overlap, then we could avoid searching
    *   for duplicates during the merge.
    *   But the question is how/when to evaluate if they cannot overlap.
    *   Example: if we know that for two initial nodes, the one is
    *   not in the ancestor-or-self axis of the other, then we could safely
    *   avoid a duplicate-aware merge, if the axis to be traversed is e.g.
    *   the descendant-or-self axis.
    */
    mergeAndClear = xmlXPathNodeSetMergeAndClear;
    switch (axis) {
        case AXIS_ANCESTOR:
            first = NULL;
            next = xmlXPathNextAncestor;
            break;
        case AXIS_ANCESTOR_OR_SELF:
            first = NULL;
            next = xmlXPathNextAncestorOrSelf;
            break;
        case AXIS_ATTRIBUTE:
            first = NULL;
	    last = NULL;
            next = xmlXPathNextAttribute;
	    mergeAndClear = xmlXPathNodeSetMergeAndClearNoDupls;
            break;
        case AXIS_CHILD:
	    last = NULL;
	    if (((test == NODE_TEST_NAME) || (test == NODE_TEST_ALL)) &&
		(type == NODE_TYPE_NODE))
	    {
		/*
		* Optimization if an element node type is 'element'.
		*/
		next = xmlXPathNextChildElement;
	    } else
		next = xmlXPathNextChild;
	    mergeAndClear = xmlXPathNodeSetMergeAndClearNoDupls;
            break;
        case AXIS_DESCENDANT:
	    last = NULL;
            next = xmlXPathNextDescendant;
            break;
        case AXIS_DESCENDANT_OR_SELF:
	    last = NULL;
            next = xmlXPathNextDescendantOrSelf;
            break;
        case AXIS_FOLLOWING:
	    last = NULL;
            next = xmlXPathNextFollowing;
            break;
        case AXIS_FOLLOWING_SIBLING:
	    last = NULL;
            next = xmlXPathNextFollowingSibling;
            break;
        case AXIS_NAMESPACE:
            first = NULL;
	    last = NULL;
            next = (xmlXPathTraversalFunction) xmlXPathNextNamespace;
	    mergeAndClear = xmlXPathNodeSetMergeAndClearNoDupls;
            break;
        case AXIS_PARENT:
            first = NULL;
            next = xmlXPathNextParent;
            break;
        case AXIS_PRECEDING:
            first = NULL;
            next = xmlXPathNextPrecedingInternal;
            break;
        case AXIS_PRECEDING_SIBLING:
            first = NULL;
            next = xmlXPathNextPrecedingSibling;
            break;
        case AXIS_SELF:
            first = NULL;
	    last = NULL;
            next = xmlXPathNextSelf;
	    mergeAndClear = xmlXPathNodeSetMergeAndClearNoDupls;
            break;
    }

    if (next == NULL) {
	xmlXPathReleaseObject(xpctxt, obj);
        return(0);
    }
    contextSeq = obj->nodesetval;
    if ((contextSeq == NULL) || (contextSeq->nodeNr <= 0)) {
        xmlXPathValuePush(ctxt, obj);
        return(0);
    }
    /*
    * Predicate optimization ---------------------------------------------
    * If this step has a last predicate, which contains a position(),
    * then we'll optimize (although not exactly "position()", but only
    * the  short-hand form, i.e., "[n]".
    *
    * Example - expression "/foo[parent::bar][1]":
    *
    * COLLECT 'child' 'name' 'node' foo    -- op (we are here)
    *   ROOT                               -- op->ch1
    *   PREDICATE                          -- op->ch2 (predOp)
    *     PREDICATE                          -- predOp->ch1 = [parent::bar]
    *       SORT
    *         COLLECT  'parent' 'name' 'node' bar
    *           NODE
    *     ELEM Object is a number : 1        -- predOp->ch2 = [1]
    *
    */
    maxPos = 0;
    predOp = NULL;
    hasPredicateRange = 0;
    hasAxisRange = 0;
    if (op->ch2 != -1) {
	/*
	* There's at least one predicate. 16 == XPATH_OP_PREDICATE
	*/
	predOp = &ctxt->comp->steps[op->ch2];
	if (xmlXPathIsPositionalPredicate(ctxt, predOp, &maxPos)) {
	    if (predOp->ch1 != -1) {
		/*
		* Use the next inner predicate operator.
		*/
		predOp = &ctxt->comp->steps[predOp->ch1];
		hasPredicateRange = 1;
	    } else {
		/*
		* There's no other predicate than the [n] predicate.
		*/
		predOp = NULL;
		hasAxisRange = 1;
	    }
	}
    }
    breakOnFirstHit = ((toBool) && (predOp == NULL)) ? 1 : 0;
    /*
    * Axis traversal -----------------------------------------------------
    */
    /*
     * 2.3 Node Tests
     *  - For the attribute axis, the principal node type is attribute.
     *  - For the namespace axis, the principal node type is namespace.
     *  - For other axes, the principal node type is element.
     *
     * A node test * is true for any node of the
     * principal node type. For example, child::* will
     * select all element children of the context node
     */
    oldContextNode = xpctxt->node;
    addNode = xmlXPathNodeSetAddUnique;
    outSeq = NULL;
    seq = NULL;
    contextNode = NULL;
    contextIdx = 0;


    while (((contextIdx < contextSeq->nodeNr) || (contextNode != NULL)) &&
           (ctxt->error == XPATH_EXPRESSION_OK)) {
	xpctxt->node = contextSeq->nodeTab[contextIdx++];

	if (seq == NULL) {
	    seq = xmlXPathNodeSetCreate(NULL);
	    if (seq == NULL) {
                xmlXPathPErrMemory(ctxt);
		total = 0;
		goto error;
	    }
	}
	/*
	* Traverse the axis and test the nodes.
	*/
	pos = 0;
	cur = NULL;
	hasNsNodes = 0;
        do {
            if (OP_LIMIT_EXCEEDED(ctxt, 1))
                goto error;

            cur = next(ctxt, cur);
            if (cur == NULL)
                break;

	    /*
	    * QUESTION TODO: What does the "first" and "last" stuff do?
	    */
            if ((first != NULL) && (*first != NULL)) {
		if (*first == cur)
		    break;
		if (((total % 256) == 0) &&
#ifdef XP_OPTIMIZED_NON_ELEM_COMPARISON
		    (xmlXPathCmpNodesExt(*first, cur) >= 0))
#else
		    (xmlXPathCmpNodes(*first, cur) >= 0))
#endif
		{
		    break;
		}
	    }
	    if ((last != NULL) && (*last != NULL)) {
		if (*last == cur)
		    break;
		if (((total % 256) == 0) &&
#ifdef XP_OPTIMIZED_NON_ELEM_COMPARISON
		    (xmlXPathCmpNodesExt(cur, *last) >= 0))
#else
		    (xmlXPathCmpNodes(cur, *last) >= 0))
#endif
		{
		    break;
		}
	    }

            total++;

	    switch (test) {
                case NODE_TEST_NONE:
		    total = 0;
		    goto error;
                case NODE_TEST_TYPE:
		    if (type == NODE_TYPE_NODE) {
			switch (cur->type) {
			    case XML_DOCUMENT_NODE:
			    case XML_HTML_DOCUMENT_NODE:
			    case XML_ELEMENT_NODE:
			    case XML_ATTRIBUTE_NODE:
			    case XML_PI_NODE:
			    case XML_COMMENT_NODE:
			    case XML_CDATA_SECTION_NODE:
			    case XML_TEXT_NODE:
				XP_TEST_HIT
				break;
			    case XML_NAMESPACE_DECL: {
				if (axis == AXIS_NAMESPACE) {
				    XP_TEST_HIT_NS
				} else {
	                            hasNsNodes = 1;
				    XP_TEST_HIT
				}
				break;
                            }
			    default:
				break;
			}
		    } else if (cur->type == (xmlElementType) type) {
			if (cur->type == XML_NAMESPACE_DECL)
			    XP_TEST_HIT_NS
			else
			    XP_TEST_HIT
		    } else if ((type == NODE_TYPE_TEXT) &&
			 (cur->type == XML_CDATA_SECTION_NODE))
		    {
			XP_TEST_HIT
		    }
		    break;
                case NODE_TEST_PI:
                    if ((cur->type == XML_PI_NODE) &&
                        ((name == NULL) || xmlStrEqual(name, cur->name)))
		    {
			XP_TEST_HIT
                    }
                    break;
                case NODE_TEST_ALL:
                    if (axis == AXIS_ATTRIBUTE) {
                        if (cur->type == XML_ATTRIBUTE_NODE)
			{
                            if (prefix == NULL)
			    {
				XP_TEST_HIT
                            } else if ((cur->ns != NULL) &&
				(xmlStrEqual(URI, cur->ns->href)))
			    {
				XP_TEST_HIT
                            }
                        }
                    } else if (axis == AXIS_NAMESPACE) {
                        if (cur->type == XML_NAMESPACE_DECL)
			{
			    XP_TEST_HIT_NS
                        }
                    } else {
                        if (cur->type == XML_ELEMENT_NODE) {
                            if (prefix == NULL)
			    {
				XP_TEST_HIT

                            } else if ((cur->ns != NULL) &&
				(xmlStrEqual(URI, cur->ns->href)))
			    {
				XP_TEST_HIT
                            }
                        }
                    }
                    break;
                case NODE_TEST_NS:{
                        /* TODO */
                        break;
                    }
                case NODE_TEST_NAME:
                    if (axis == AXIS_ATTRIBUTE) {
                        if (cur->type != XML_ATTRIBUTE_NODE)
			    break;
		    } else if (axis == AXIS_NAMESPACE) {
                        if (cur->type != XML_NAMESPACE_DECL)
			    break;
		    } else {
		        if (cur->type != XML_ELEMENT_NODE)
			    break;
		    }
                    switch (cur->type) {
                        case XML_ELEMENT_NODE:
                            if (xmlStrEqual(name, cur->name)) {
                                if (prefix == NULL) {
                                    if (cur->ns == NULL)
				    {
					XP_TEST_HIT
                                    }
                                } else {
                                    if ((cur->ns != NULL) &&
                                        (xmlStrEqual(URI, cur->ns->href)))
				    {
					XP_TEST_HIT
                                    }
                                }
                            }
                            break;
                        case XML_ATTRIBUTE_NODE:{
                                xmlAttrPtr attr = (xmlAttrPtr) cur;

                                if (xmlStrEqual(name, attr->name)) {
                                    if (prefix == NULL) {
                                        if ((attr->ns == NULL) ||
                                            (attr->ns->prefix == NULL))
					{
					    XP_TEST_HIT
                                        }
                                    } else {
                                        if ((attr->ns != NULL) &&
                                            (xmlStrEqual(URI,
					      attr->ns->href)))
					{
					    XP_TEST_HIT
                                        }
                                    }
                                }
                                break;
                            }
                        case XML_NAMESPACE_DECL:
                            if (cur->type == XML_NAMESPACE_DECL) {
                                xmlNsPtr ns = (xmlNsPtr) cur;

                                if ((ns->prefix != NULL) && (name != NULL)
                                    && (xmlStrEqual(ns->prefix, name)))
				{
				    XP_TEST_HIT_NS
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
	    } /* switch(test) */
        } while ((cur != NULL) && (ctxt->error == XPATH_EXPRESSION_OK));

	goto apply_predicates;

axis_range_end: /* ----------------------------------------------------- */
	/*
	* We have a "/foo[n]", and position() = n was reached.
	* Note that we can have as well "/foo/::parent::foo[1]", so
	* a duplicate-aware merge is still needed.
	* Merge with the result.
	*/
	if (outSeq == NULL) {
	    outSeq = seq;
	    seq = NULL;
	} else {
	    outSeq = mergeAndClear(outSeq, seq);
            if (outSeq == NULL)
                xmlXPathPErrMemory(ctxt);
        }
	/*
	* Break if only a true/false result was requested.
	*/
	if (toBool)
	    break;
	continue;

first_hit: /* ---------------------------------------------------------- */
	/*
	* Break if only a true/false result was requested and
	* no predicates existed and a node test succeeded.
	*/
	if (outSeq == NULL) {
	    outSeq = seq;
	    seq = NULL;
	} else {
	    outSeq = mergeAndClear(outSeq, seq);
            if (outSeq == NULL)
                xmlXPathPErrMemory(ctxt);
        }
	break;

apply_predicates: /* --------------------------------------------------- */
        if (ctxt->error != XPATH_EXPRESSION_OK)
	    goto error;

        /*
	* Apply predicates.
	*/
        if ((predOp != NULL) && (seq->nodeNr > 0)) {
	    /*
	    * E.g. when we have a "/foo[some expression][n]".
	    */
	    /*
	    * QUESTION TODO: The old predicate evaluation took into
	    *  account location-sets.
	    *  (E.g. ctxt->value->type == XPATH_LOCATIONSET)
	    *  Do we expect such a set here?
	    *  All what I learned now from the evaluation semantics
	    *  does not indicate that a location-set will be processed
	    *  here, so this looks OK.
	    */
	    /*
	    * Iterate over all predicates, starting with the outermost
	    * predicate.
	    * TODO: Problem: we cannot execute the inner predicates first
	    *  since we cannot go back *up* the operator tree!
	    *  Options we have:
	    *  1) Use of recursive functions (like is it currently done
	    *     via xmlXPathCompOpEval())
	    *  2) Add a predicate evaluation information stack to the
	    *     context struct
	    *  3) Change the way the operators are linked; we need a
	    *     "parent" field on xmlXPathStepOp
	    *
	    * For the moment, I'll try to solve this with a recursive
	    * function: xmlXPathCompOpEvalPredicate().
	    */
	    if (hasPredicateRange != 0)
		xmlXPathCompOpEvalPredicate(ctxt, predOp, seq, maxPos, maxPos,
					    hasNsNodes);
	    else
		xmlXPathCompOpEvalPredicate(ctxt, predOp, seq, 1, seq->nodeNr,
					    hasNsNodes);

	    if (ctxt->error != XPATH_EXPRESSION_OK) {
		total = 0;
		goto error;
	    }
        }

        if (seq->nodeNr > 0) {
	    /*
	    * Add to result set.
	    */
	    if (outSeq == NULL) {
		outSeq = seq;
		seq = NULL;
	    } else {
		outSeq = mergeAndClear(outSeq, seq);
                if (outSeq == NULL)
                    xmlXPathPErrMemory(ctxt);
	    }

            if (toBool)
                break;
	}
    }

error:
    if ((obj->boolval) && (obj->user != NULL)) {
	/*
	* QUESTION TODO: What does this do and why?
	* TODO: Do we have to do this also for the "error"
	* cleanup further down?
	*/
	ctxt->value->boolval = 1;
	ctxt->value->user = obj->user;
	obj->user = NULL;
	obj->boolval = 0;
    }
    xmlXPathReleaseObject(xpctxt, obj);

    /*
    * Ensure we return at least an empty set.
    */
    if (outSeq == NULL) {
	if ((seq != NULL) && (seq->nodeNr == 0)) {
	    outSeq = seq;
        } else {
	    outSeq = xmlXPathNodeSetCreate(NULL);
            if (outSeq == NULL)
                xmlXPathPErrMemory(ctxt);
        }
    }
    if ((seq != NULL) && (seq != outSeq)) {
	 xmlXPathFreeNodeSet(seq);
    }
    /*
    * Hand over the result. Better to push the set also in
    * case of errors.
    */
    xmlXPathValuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt, outSeq));
    /*
    * Reset the context node.
    */
    xpctxt->node = oldContextNode;
    /*
    * When traversing the namespace axis in "toBool" mode, it's
    * possible that tmpNsList wasn't freed.
    */
    if (xpctxt->tmpNsList != NULL) {
        xmlFree(xpctxt->tmpNsList);
        xpctxt->tmpNsList = NULL;
    }

    return(total);
}